

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReFinalize.cpp
# Opt level: O0

void __thiscall wasm::ReFinalize::visitResumeThrow(ReFinalize *this,ResumeThrow *curr)

{
  string_view name;
  size_t sVar1;
  Name *pNVar2;
  Type *pTVar3;
  ulong local_20;
  size_t i;
  ResumeThrow *curr_local;
  ReFinalize *this_local;
  
  ResumeThrow::finalize(curr);
  local_20 = 0;
  while( true ) {
    sVar1 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                      (&(curr->handlerBlocks).
                        super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>);
    if (sVar1 <= local_20) break;
    pNVar2 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                       (&(curr->handlerBlocks).
                         super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,local_20);
    name = (pNVar2->super_IString).str;
    pTVar3 = ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>::operator[]
                       (&(curr->sentTypes).
                         super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>,local_20);
    updateBreakValueType(this,(Name)name,(Type)pTVar3->id);
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void ReFinalize::visitResumeThrow(ResumeThrow* curr) {
  curr->finalize();
  for (size_t i = 0; i < curr->handlerBlocks.size(); i++) {
    updateBreakValueType(curr->handlerBlocks[i], curr->sentTypes[i]);
  }
}